

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O0

int Assimp_Export(char **params,uint num)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  aiScene *local_200;
  aiScene *scene;
  aiExportFormatDesc *e;
  long local_1d0;
  size_type s_1;
  size_t local_1c0;
  size_t outfi;
  char *local_1b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  uint local_148;
  allocator local_141;
  uint i;
  string outf;
  ImportData import;
  string local_d0 [32];
  long local_b0;
  size_type s;
  string outext;
  undefined1 local_80 [8];
  string out;
  allocator local_49;
  undefined1 local_48 [8];
  string in;
  char *invalid;
  uint num_local;
  char **params_local;
  
  in.field_2._8_8_ = anon_var_dwarf_2336d;
  if (num == 0) {
    printf("assimp export: Invalid number of arguments. See \'assimp export --help\'\n");
    return 1;
  }
  iVar2 = strcmp(*params,"-h");
  if (((iVar2 == 0) || (iVar2 = strcmp(*params,"--help"), iVar2 == 0)) ||
     (iVar2 = strcmp(*params,"-?"), iVar2 == 0)) {
    printf("%s",AICMD_MSG_EXPORT_HELP_E);
    return 0;
  }
  pcVar3 = *params;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,pcVar3,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  outext.field_2._M_local_buf[0xe] = '\0';
  outext.field_2._M_local_buf[0xc] = '\0';
  if (num < 2) {
    std::allocator<char>::allocator();
    outext.field_2._M_local_buf[0xc] = '\x01';
    std::__cxx11::string::string
              ((string *)local_80,"-",(allocator *)(outext.field_2._M_local_buf + 0xd));
  }
  else {
    pcVar3 = params[1];
    std::allocator<char>::allocator();
    outext.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string
              ((string *)local_80,pcVar3,(allocator *)(outext.field_2._M_local_buf + 0xf));
  }
  if ((outext.field_2._M_local_buf[0xc] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(outext.field_2._M_local_buf + 0xd));
  }
  if ((outext.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(outext.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::string((string *)&s);
  local_b0 = std::__cxx11::string::find_last_of((char)local_80,0x2e);
  if (local_b0 != -1) {
    std::__cxx11::string::substr((ulong)local_d0,(ulong)local_80);
    std::__cxx11::string::operator=((string *)&s,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::substr((ulong)&import.verbose,(ulong)local_80);
    std::__cxx11::string::operator=((string *)local_80,(string *)&import.verbose);
    std::__cxx11::string::~string((string *)&import.verbose);
  }
  ImportData::ImportData((ImportData *)((long)&outf.field_2 + 8));
  ProcessStandardArguments((ImportData *)((long)&outf.field_2 + 8),params + 1,num - 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
  local_148 = 2;
  if (*pcVar3 == '-') {
    local_148 = 1;
  }
  for (; local_148 < num; local_148 = local_148 + 1) {
    if (params[local_148] != (char *)0x0) {
      iVar2 = strncmp(params[local_148],"-f",2);
      if (iVar2 == 0) {
        iVar2 = strncmp(params[local_148],"-fi",3);
        if (iVar2 != 0) {
          pcVar3 = params[local_148];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_168,pcVar3 + 2,&local_169);
          std::__cxx11::string::operator=((string *)&i,local_168);
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator((allocator<char> *)&local_169);
        }
      }
      else {
        iVar2 = strncmp(params[local_148],"--format=",9);
        if (iVar2 == 0) {
          pcVar3 = params[local_148];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_190,pcVar3 + 9,&local_191);
          std::__cxx11::string::operator=((string *)&i,local_190);
          std::__cxx11::string::~string(local_190);
          std::allocator<char>::~allocator((allocator<char> *)&local_191);
        }
      }
    }
  }
  local_1a0._M_current = (char *)std::__cxx11::string::begin();
  local_1a8._M_current = (char *)std::__cxx11::string::end();
  local_1b0 = (char *)std::__cxx11::string::begin();
  outfi = (size_t)std::
                  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                            (local_1a0,local_1a8,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_1b0,tolower);
  local_1c0 = GetMatchingFormat((string *)&i,false);
  if (local_1c0 == 0xffffffffffffffff) {
    lVar4 = std::__cxx11::string::length();
    if (lVar4 != 0) {
      uVar5 = std::__cxx11::string::c_str();
      printf("assimp export: warning, format id \'%s\' is unknown\n",uVar5);
    }
    local_1c0 = GetMatchingFormat((string *)&i,true);
    if (local_1c0 == 0xffffffffffffffff) {
      local_1c0 = GetMatchingFormat((string *)&s,true);
      if (local_1c0 == 0xffffffffffffffff) {
        printf("assimp export: no output format specified and I failed to guess it\n");
        params_local._4_4_ = -0x17;
        goto LAB_004012e6;
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&s,(string *)&i);
    }
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
  if (*pcVar3 == '-') {
    local_1d0 = std::__cxx11::string::find_last_of((char)local_48,0x2e);
    if (local_1d0 == -1) {
      local_1d0 = std::__cxx11::string::length();
    }
    std::__cxx11::string::substr((ulong)&e,(ulong)local_48);
    std::__cxx11::string::operator=((string *)local_80,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  scene = (aiScene *)Assimp::Exporter::GetExportFormatDescription(globalExporter,local_1c0);
  printf("assimp export: select file format: \'%s\' (%s)\n",*(undefined8 *)scene,scene->mRootNode);
  local_200 = ImportModel((ImportData *)((long)&outf.field_2 + 8),(string *)local_48);
  if (local_200 == (aiScene *)0x0) {
    params_local._4_4_ = -0x27;
  }
  else {
    std::operator+(&local_220,".",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
    std::__cxx11::string::operator+=((string *)local_80,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    bVar1 = ExportModel(local_200,(ImportData *)((long)&outf.field_2 + 8),(string *)local_80,
                        *(char **)scene);
    if (bVar1) {
      uVar5 = std::__cxx11::string::c_str();
      printf("assimp export: wrote output file: %s\n",uVar5);
      params_local._4_4_ = 0;
    }
    else {
      params_local._4_4_ = -0x19;
    }
  }
LAB_004012e6:
  s_1._4_4_ = 1;
  std::__cxx11::string::~string((string *)&i);
  ImportData::~ImportData((ImportData *)((long)&outf.field_2 + 8));
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return params_local._4_4_;
}

Assistant:

int Assimp_Export(const char* const* params, unsigned int num)
{
	const char* const invalid = "assimp export: Invalid number of arguments. See \'assimp export --help\'\n";
	if (num < 1) {
		printf(invalid);
		return 1;
	}

	// --help
	if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
		printf("%s",AICMD_MSG_EXPORT_HELP_E);
		return 0;
	}

	std::string in  = std::string(params[0]);
	std::string out = (num > 1 ? std::string(params[1]) : "-"), outext;

	// 
	const std::string::size_type s = out.find_last_of('.');
	if (s != std::string::npos) {
		outext = out.substr(s+1);
		out = out.substr(0,s);
	}

	// get import flags
	ImportData import;
	ProcessStandardArguments(import,params+1,num-1);

	// process other flags
	std::string outf = "";
	for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)		{
		if (!params[i]) {
			continue;
		}
		if (!strncmp( params[i], "-f",2)) {
            if ( strncmp( params[ i ], "-fi",3 ))
			    outf = std::string(params[i]+2);
		}
		else if ( !strncmp( params[i], "--format=",9)) {
			outf = std::string(params[i]+9);
		}
	}

	std::transform(outf.begin(),outf.end(),outf.begin(),::tolower);

	// convert the output format to a format id
	size_t outfi = GetMatchingFormat(outf);
	if (outfi == SIZE_MAX) {
		if (outf.length()) {
			printf("assimp export: warning, format id \'%s\' is unknown\n",outf.c_str());
		}

		// retry to see if we know it as file extension
		outfi = GetMatchingFormat(outf,true);
		if (outfi == SIZE_MAX) {
			// retry to see if we know the file extension of the output file
			outfi = GetMatchingFormat(outext,true);

			if (outfi == SIZE_MAX) {
				// still no match -> failure
				printf("assimp export: no output format specified and I failed to guess it\n");
				return -23;
			}
		}
		else {
			outext = outf;
		}
	}
	
	// if no output file is specified, take the file name from input file
	if (out[0] == '-') {
		std::string::size_type s = in.find_last_of('.');
		if (s == std::string::npos) {
			s = in.length();
		}

		out = in.substr(0,s);
	}

	const aiExportFormatDesc* const e =  globalExporter->GetExportFormatDescription(outfi);
	printf("assimp export: select file format: \'%s\' (%s)\n",e->id,e->description);
	
	// import the  model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		return -39;
	}

	// derive the final file name
	out += "."+outext;

	// and call the export routine
	if(!ExportModel(scene, import, out,e->id)) {
		return -25;
	}
	printf("assimp export: wrote output file: %s\n",out.c_str());
	return 0;
}